

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O1

void lua_settable(lua_State *L,int idx)

{
  long lVar1;
  int hres;
  TValue *t;
  
  t = index2value(L,idx);
  hres = 2;
  if (t->tt_ == 'E') {
    hres = luaH_pset((Table *)(t->value_).gc,(TValue *)((L->top).offset + -0x20),
                     (TValue *)((L->top).offset + -0x10));
  }
  lVar1 = (L->top).offset;
  if (hres == 0) {
    if ((((*(byte *)(lVar1 + -8) & 0x40) != 0) && ((((t->value_).gc)->marked & 0x20) != 0)) &&
       ((*(byte *)(*(long *)(lVar1 + -0x10) + 9) & 0x18) != 0)) {
      luaC_barrierback_(L,(t->value_).gc);
    }
  }
  else {
    luaV_finishset(L,t,(TValue *)(lVar1 + -0x20),(TValue *)(lVar1 + -0x10),hres);
  }
  (L->top).p = (StkId)((L->top).offset + -0x20);
  return;
}

Assistant:

LUA_API void lua_settable (lua_State *L, int idx) {
  TValue *t;
  int hres;
  lua_lock(L);
  api_checkpop(L, 2);
  t = index2value(L, idx);
  luaV_fastset(t, s2v(L->top.p - 2), s2v(L->top.p - 1), hres, luaH_pset);
  if (hres == HOK)
    luaV_finishfastset(L, t, s2v(L->top.p - 1));
  else
    luaV_finishset(L, t, s2v(L->top.p - 2), s2v(L->top.p - 1), hres);
  L->top.p -= 2;  /* pop index and value */
  lua_unlock(L);
}